

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::readCppStyleComment(Reader *this)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = this->current_;
  while( true ) {
    pcVar2 = pcVar1;
    if (pcVar2 == this->end_) {
      return true;
    }
    pcVar1 = pcVar2 + 1;
    this->current_ = pcVar1;
    if (*pcVar2 == '\n') break;
    if (*pcVar2 == '\r') {
      if ((pcVar1 != this->end_) && (*pcVar1 == '\n')) {
        this->current_ = pcVar2 + 2;
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool Reader::readCppStyleComment() {
  while (current_ != end_) {
    Char c = getNextChar();
    if (c == '\n')
      break;
    if (c == '\r') {
      // Consume DOS EOL. It will be normalized in addComment.
      if (current_ != end_ && *current_ == '\n')
        getNextChar();
      // Break on Moc OS 9 EOL.
      break;
    }
  }
  return true;
}